

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QVariant * QVariant::moveConstruct(QMetaType type,void *data)

{
  long lVar1;
  QMetaTypeInterface *in_RDI;
  long in_FS_OFFSET;
  QVariant *var;
  QMetaTypeInterface *in_stack_ffffffffffffff88;
  Private *in_stack_ffffffffffffff90;
  QMetaTypeInterface *iface;
  undefined8 local_28;
  undefined8 uStack_20;
  MetaObjectFn local_18;
  char *pcStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->metaObjectFn = (MetaObjectFn)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->name = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->flags = &DAT_aaaaaaaaaaaaaaaa;
  iface = in_RDI;
  QVariant((QVariant *)0x438dd1);
  Private::Private(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  in_RDI->metaObjectFn = local_18;
  in_RDI->name = pcStack_10;
  in_RDI->revision = (undefined2)local_28;
  in_RDI->alignment = local_28._2_2_;
  in_RDI->size = local_28._4_4_;
  in_RDI->flags = (undefined4)uStack_20;
  in_RDI->typeId = (QBasicAtomicInt)uStack_20._4_4_;
  (anonymous_namespace)::
  customConstruct<((anonymous_namespace)::CustomConstructMoveOptions)1,((anonymous_namespace)::CustomConstructNullabilityOption)1>
            (iface,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QVariant *)iface;
}

Assistant:

QVariant QVariant::moveConstruct(QMetaType type, void *data)
{
    QVariant var;
    var.d = QVariant::Private(type.d_ptr);
    customConstruct<ForceMove, NonNull>(type.d_ptr, &var.d, data);
    return var;
}